

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBuilderBeam.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBuilderCableANCF::BuildBeam
          (ChBuilderCableANCF *this,shared_ptr<chrono::fea::ChMesh> *mesh,
          shared_ptr<chrono::fea::ChBeamSectionCable> *sect,int N,ChVector<double> *A,
          ChVector<double> *B,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *nodes,vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *node_nbrs)

{
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  *this_00;
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  ChMesh *pCVar4;
  pointer psVar5;
  iterator iVar6;
  int iVar7;
  uint uVar8;
  ChElementCableANCF *this_01;
  int iVar9;
  value_type *__x;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 in_ZMM6 [64];
  shared_ptr<chrono::fea::ChElementCableANCF> element;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeB;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> nodeA;
  ChVector<double> pos;
  int local_13c;
  ChVector<double> local_138;
  value_type local_120;
  ulong local_110;
  ChVector<double> *local_108;
  shared_ptr<chrono::fea::ChMesh> *local_100;
  value_type local_f8;
  double local_e8;
  ChVector<double> *local_e0;
  shared_ptr<chrono::fea::ChElementBase> local_d8;
  element_type *local_c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined8 local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  undefined8 local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_98;
  shared_ptr<chrono::fea::ChNodeFEAbase> local_88;
  value_type local_78;
  ChVector<double> local_68;
  shared_ptr<chrono::fea::ChBeamSectionCable> *local_48;
  ChBuilderCableANCF *local_40;
  double local_38;
  
  local_100 = mesh;
  local_48 = sect;
  std::
  vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
  ::clear(&this->beam_elems);
  this_00 = &this->beam_nodes;
  local_40 = this;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::clear(this_00);
  lVar11 = (long)(nodes->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(nodes->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start >> 3;
  uVar12 = lVar11 * -0x5555555555555555;
  pvVar2 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = (node_nbrs->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_110 = CONCAT44(local_110._4_4_,N);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(nodes,uVar12 + (long)N);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(node_nbrs,(long)N + 1 + ((long)pvVar2 - (long)pvVar3 >> 3) * -0x5555555555555555);
  local_138.m_data[0] = B->m_data[0] - A->m_data[0];
  local_138.m_data[1] = B->m_data[1] - A->m_data[1];
  local_138.m_data[2] = B->m_data[2] - A->m_data[2];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_138.m_data[1] * local_138.m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_138.m_data[0];
  auVar14 = vfmadd231sd_fma(auVar14,auVar16,auVar16);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_138.m_data[2];
  auVar14 = vfmadd231sd_fma(auVar14,auVar18,auVar18);
  local_108 = A;
  local_e0 = B;
  if (auVar14._0_8_ < 0.0) {
    dVar13 = sqrt(auVar14._0_8_);
  }
  else {
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    dVar13 = auVar14._0_8_;
  }
  uVar10 = local_110;
  iVar9 = (int)local_110;
  if (dVar13 < 2.2250738585072014e-308) {
    local_138.m_data[0] = 1.0;
    local_138.m_data[1] = 0.0;
    local_138.m_data[2] = 0.0;
  }
  else {
    dVar13 = 1.0 / dVar13;
    local_138.m_data[0] = dVar13 * local_138.m_data[0];
    local_138.m_data[1] = dVar13 * local_138.m_data[1];
    local_138.m_data[2] = dVar13 * local_138.m_data[2];
  }
  local_38 = (double)(int)local_110;
  dVar19 = 1.0 / local_38;
  dVar13 = dVar19 * (local_e0->m_data[1] - local_108->m_data[1]);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar13 * dVar13;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar19 * (local_e0->m_data[0] - local_108->m_data[0]);
  auVar14 = vfmadd231sd_fma(auVar15,auVar20,auVar20);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar19 * (local_e0->m_data[2] - local_108->m_data[2]);
  auVar14 = vfmadd231sd_fma(auVar14,auVar17,auVar17);
  if (auVar14._0_8_ < 0.0) {
    local_e8 = sqrt(auVar14._0_8_);
  }
  else {
    auVar14 = vsqrtsd_avx(auVar14,auVar14);
    local_e8 = auVar14._0_8_;
  }
  local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>const&,chrono::ChVector<double>&>
            (&local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(ChNodeFEAxyzD **)&local_78,
             (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_68,local_108,&local_138);
  pCVar4 = (local_100->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChMesh::AddNode(pCVar4,&local_88);
  if (local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ::push_back(this_00,&local_78);
  if (0 < iVar9) {
    lVar11 = lVar11 * 8;
    local_110 = (uVar10 & 0xffffffff) << 4;
    iVar9 = 1;
    uVar10 = 0;
    do {
      auVar14 = vcvtusi2sd_avx512f(in_ZMM6._0_16_,iVar9);
      dVar13 = auVar14._0_8_ / local_38;
      in_ZMM6 = ZEXT864(0) << 0x40;
      local_68.m_data[0] =
           local_108->m_data[0] + dVar13 * (local_e0->m_data[0] - local_108->m_data[0]);
      local_68.m_data[1] =
           local_108->m_data[1] + dVar13 * (local_e0->m_data[1] - local_108->m_data[1]);
      local_68.m_data[2] =
           local_108->m_data[2] + dVar13 * (local_e0->m_data[2] - local_108->m_data[2]);
      local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChNodeFEAxyzD,std::allocator<chrono::fea::ChNodeFEAxyzD>,chrono::ChVector<double>&,chrono::ChVector<double>&>
                (&local_f8.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ChNodeFEAxyzD **)&local_f8,
                 (allocator<chrono::fea::ChNodeFEAxyzD> *)&local_120,&local_68,&local_138);
      pCVar4 = (local_100->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar4,&local_98);
      if (local_98.super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_98.
                   super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      __x = &local_f8;
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::push_back(this_00,__x);
      this_01 = (ChElementCableANCF *)
                ChElementCableANCF::operator_new((ChElementCableANCF *)0xa40,(size_t)__x);
      ChElementCableANCF::ChElementCableANCF(this_01);
      local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = this_01;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementCableANCF*>
                (&local_120.
                  super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,this_01);
      std::
      vector<std::shared_ptr<chrono::fea::ChElementCableANCF>,_std::allocator<std::shared_ptr<chrono::fea::ChElementCableANCF>_>_>
      ::push_back(&local_40->beam_elems,&local_120);
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a8 = *(undefined8 *)
                  ((long)&(psVar5->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr + uVar10);
      local_a0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar5->
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi + uVar10);
      if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_a0->_M_use_count = local_a0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_a0->_M_use_count = local_a0->_M_use_count + 1;
        }
      }
      psVar5 = (this_00->
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_b8 = *(undefined8 *)
                  ((long)&psVar5[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr + uVar10);
      local_b0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&psVar5[1].
                          super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi + uVar10);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
        }
      }
      (*((local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->super_ChElementBeam).super_ChElementGeneric.super_ChElementBase.
        _vptr_ChElementBase[0x1a])
                (local_120.
                 super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,&local_a8,&local_b8);
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
      }
      local_c8 = (local_48->
                 super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
      local_c0._M_pi =
           (local_48->
           super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_c0._M_pi)->_M_use_count = (local_c0._M_pi)->_M_use_count + 1;
        }
      }
      ((local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->section).
      super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_c8;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&((local_120.
                    super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->section).
                  super___shared_ptr<chrono::fea::ChBeamSectionCable,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_c0);
      if (local_c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0._M_pi);
      }
      ((local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr)->super_ChElementBeam).length = local_e8;
      pCVar4 = (local_100->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_d8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      local_d8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_120.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_120.
                super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddElement(pCVar4,&local_d8);
      if (local_d8.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pvVar2 = (nodes->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_13c = (**(code **)(**(long **)((long)&(((this_00->
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + uVar10) + 0x28))();
      local_13c = local_13c + -1;
      iVar6._M_current =
           *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar11);
      if (iVar6._M_current ==
          *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11),iVar6,&local_13c);
      }
      else {
        *iVar6._M_current = local_13c;
        *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar11) = iVar6._M_current + 1;
      }
      pvVar2 = (nodes->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_13c = (**(code **)(**(long **)((long)&(((this_00->
                                                                                                        
                                                  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                                  )._M_ptr + uVar10) + 0x28))();
      iVar6._M_current =
           *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish + lVar11);
      if (iVar6._M_current ==
          *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage + lVar11)) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)
                   ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start + lVar11),iVar6,&local_13c);
      }
      else {
        *iVar6._M_current = local_13c;
        *(int **)((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish + lVar11) = iVar6._M_current + 1;
      }
      iVar7 = (**(code **)(**(long **)((long)&(((this_00->
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + uVar10) + 0x28))();
      pvVar1 = (node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + (iVar7 - 1);
      iVar7 = (int)uVar12;
      iVar6._M_current =
           (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      local_13c = iVar7;
      if (iVar6._M_current ==
          (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar6,&local_13c);
      }
      else {
        *iVar6._M_current = iVar7;
        (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar6._M_current + 1;
      }
      uVar8 = (**(code **)(**(long **)((long)&(((this_00->
                                                super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start)->
                                              super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + uVar10) + 0x28))();
      pvVar1 = (node_nbrs->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar8;
      iVar6._M_current =
           (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar6._M_current ==
          (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        local_13c = iVar7;
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(pvVar1,iVar6,&local_13c);
      }
      else {
        *iVar6._M_current = iVar7;
        (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar6._M_current + 1;
        local_13c = iVar7;
      }
      if (local_120.super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.
                   super___shared_ptr<chrono::fea::ChElementCableANCF,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar12 = (ulong)(iVar7 + 1);
      lVar11 = lVar11 + 0x18;
      uVar10 = uVar10 + 0x10;
      iVar9 = iVar9 + 1;
    } while (local_110 != uVar10);
  }
  if (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChBuilderCableANCF::BuildBeam(std::shared_ptr<ChMesh> mesh,              // mesh to store the resulting elements
                                   std::shared_ptr<ChBeamSectionCable> sect,  // section material for beam elements
                                   const int N,                               // number of elements in the segment
                                   const ChVector<> A,                        // starting point
                                   const ChVector<> B,                        // ending point
                                   std::vector<std::vector<int>>& nodes,      // node indices for all elements
                                   std::vector<std::vector<int>>& node_nbrs   // neighbor node indices (connectivity)
) {
    beam_elems.clear();
    beam_nodes.clear();
    auto n_nodes = nodes.size();
    auto n_nbrs = node_nbrs.size();

    nodes.resize(N + n_nodes);
    node_nbrs.resize(N + 1 + n_nbrs);
    ChVector<> bdir = (B - A);
    bdir.Normalize();

    double restlength = ((B - A) / N).Length();

    auto nodeA = chrono_types::make_shared<ChNodeFEAxyzD>(A, bdir);
    mesh->AddNode(nodeA);
    beam_nodes.push_back(nodeA);

    for (int i = 0; i < N; i++) {
        double eta = (i + 1.0) / N;
        ChVector<> pos = A + (B - A) * eta;

        auto nodeB = chrono_types::make_shared<ChNodeFEAxyzD>(pos, bdir);
        mesh->AddNode(nodeB);
        beam_nodes.push_back(nodeB);

        auto element = chrono_types::make_shared<ChElementCableANCF>();

        beam_elems.push_back(element);

        element->SetNodes(beam_nodes[i], beam_nodes[i + 1]);

        element->SetSection(sect);

        element->SetRestLength(restlength);
        
        mesh->AddElement(element);

        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex() - 1);
        nodes[n_nodes + i].push_back(beam_nodes[i]->GetIndex());

        node_nbrs[beam_nodes[i]->GetIndex() - 1].push_back((int)n_nodes + i);
        node_nbrs[beam_nodes[i]->GetIndex()].push_back((int)n_nodes + i);
    }
}